

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

float Catch::anon_unknown_1::step<float>(float start,float direction,uint64_t steps)

{
  double dVar1;
  undefined8 local_20;
  uint64_t i;
  uint64_t steps_local;
  float direction_local;
  float start_local;
  
  steps_local._4_4_ = start;
  for (local_20 = 0; local_20 < steps; local_20 = local_20 + 1) {
    dVar1 = clara::std::nextafter
                      ((double)(ulong)(uint)steps_local._4_4_,(double)(ulong)(uint)direction);
    steps_local._4_4_ = SUB84(dVar1,0);
  }
  return steps_local._4_4_;
}

Assistant:

FP step(FP start, FP direction, uint64_t steps) {
    for (uint64_t i = 0; i < steps; ++i) {
#if defined(CATCH_CONFIG_GLOBAL_NEXTAFTER)
        start = Catch::nextafter(start, direction);
#else
        start = std::nextafter(start, direction);
#endif
    }
    return start;
}